

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O1

void __thiscall
BRTS_XZ<RemSP>::PerformLabelingMem
          (BRTS_XZ<RemSP> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint height;
  int iVar5;
  Mat1b *pMVar6;
  pointer puVar7;
  pointer puVar8;
  pointer piVar9;
  Run *pRVar10;
  uint64_t *puVar11;
  Run *pRVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  double dVar20;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  Size local_2a0;
  undefined1 local_298 [8];
  void *pvStack_290;
  Size local_288;
  undefined4 local_238;
  Mat *local_230;
  undefined8 local_228;
  undefined1 local_220 [104];
  Mat local_1b8 [16];
  long local_1a8;
  long *local_170;
  MemMat<unsigned_char> local_158;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat(&local_158,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar13 = **(ulong **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_2a0 = (Size)(uVar13 << 0x20 | uVar13 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_220,&local_2a0,0);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar4 = *(uint *)&pMVar6->field_0xc;
  height = *(uint *)&pMVar6->field_0x8;
  (this->data_compressed).height = height;
  (this->data_compressed).width = uVar4;
  uVar14 = uVar4 + 0x3f;
  if (-1 < (long)(int)uVar4) {
    uVar14 = uVar4;
  }
  iVar15 = ((int)uVar14 >> 6) + 1;
  (this->data_compressed).data_width = iVar15;
  iVar15 = iVar15 * height;
  uVar13 = 0xffffffffffffffff;
  if (-1 < iVar15) {
    uVar13 = (long)iVar15 * 8;
  }
  puVar11 = (uint64_t *)operator_new__(uVar13);
  (this->data_compressed).bits = puVar11;
  InitCompressedDataMem(this,&this->data_compressed,&local_158);
  (this->data_runs).height = height;
  (this->data_runs).width = uVar4;
  pRVar12 = (Run *)operator_new__((ulong)(((uVar4 >> 1) + 2) * height + 1) << 3);
  (this->data_runs).runs = pRVar12;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar15 = *(int *)&pMVar6->field_0x8;
  iVar5 = *(int *)&pMVar6->field_0xc;
  RemSP::MemAlloc(((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1) *
                  ((iVar15 - (iVar15 + 1 >> 0x1f)) + 1 >> 1) + 1);
  *RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  RemSP::length_ = 1;
  FindRunsMem(this,(this->data_compressed).bits,height,(this->data_compressed).data_width,
              (this->data_runs).runs);
  if (0 < (int)height) {
    pRVar12 = (this->data_runs).runs;
    uVar13 = 0;
    do {
      piVar9 = RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar8 = RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar15 = 0;
      pRVar10 = pRVar12;
      do {
        pRVar12 = pRVar10;
        uVar2 = pRVar12->start_pos;
        if (uVar2 == 0xffff) {
          if (iVar15 < (int)uVar4) {
            lVar18 = (long)iVar15;
            lVar16 = *local_170;
            lVar17 = *(long *)local_220._80_8_;
            lVar19 = 0;
            do {
              piVar1 = (int *)(lVar16 * uVar13 + lVar18 * 4 + local_1a8 + lVar19 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar17 * uVar13 + lVar18 * 4 + local_220._24_8_ + lVar19 * 4) = 0;
              lVar19 = lVar19 + 1;
            } while ((int)uVar4 - lVar18 != lVar19);
            iVar15 = iVar15 + (int)lVar19;
          }
          pRVar12 = pRVar12 + 1;
        }
        else {
          uVar3 = pRVar12->end_pos;
          uVar14 = pRVar12->label;
          piVar9[(int)uVar14] = piVar9[(int)uVar14] + 1;
          uVar14 = puVar8[(int)uVar14];
          if (iVar15 < (int)(uint)uVar2) {
            lVar18 = (long)iVar15;
            lVar16 = *local_170;
            lVar17 = *(long *)local_220._80_8_;
            lVar19 = 0;
            do {
              piVar1 = (int *)(lVar16 * uVar13 + lVar18 * 4 + local_1a8 + lVar19 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar17 * uVar13 + lVar18 * 4 + local_220._24_8_ + lVar19 * 4) = 0;
              lVar19 = lVar19 + 1;
            } while ((ulong)uVar2 - lVar18 != lVar19);
            iVar15 = iVar15 + (int)lVar19;
          }
          if (iVar15 < (int)(uint)uVar3) {
            lVar19 = (long)iVar15;
            lVar16 = *local_170;
            lVar17 = *(long *)local_220._80_8_;
            lVar18 = 0;
            do {
              piVar1 = (int *)(lVar16 * uVar13 + lVar19 * 4 + local_1a8 + lVar18 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(lVar17 * uVar13 + lVar19 * 4 + local_220._24_8_ + lVar18 * 4) = uVar14;
              lVar18 = lVar18 + 1;
            } while ((ulong)uVar3 - lVar19 != lVar18);
            iVar15 = iVar15 + (int)lVar18;
          }
        }
        pRVar10 = pRVar12 + 1;
      } while (uVar2 != 0xffff);
      uVar13 = uVar13 + 1;
    } while (uVar13 != height);
  }
  local_298 = (undefined1  [8])0x0;
  pvStack_290 = (void *)0x0;
  local_288.width = 0;
  local_288.height = 0;
  local_298 = (undefined1  [8])operator_new(0x20);
  pvStack_290 = (void *)((long)local_298 + 0x20);
  *(undefined8 *)((long)local_298 + 0x10) = 0;
  *(undefined8 *)((long)local_298 + 0x18) = 0;
  *(undefined8 *)local_298 = 0;
  *(undefined8 *)((long)local_298 + 8) = 0;
  local_288 = (Size)pvStack_290;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(accesses,local_298);
  if (local_298 != (undefined1  [8])0x0) {
    operator_delete((void *)local_298,(long)local_288 - (long)local_298);
  }
  local_228 = 0;
  local_238 = 0x81010004;
  local_230 = &local_158.accesses_.super_Mat;
  cv::sum((_InputArray *)local_298);
  *(accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_298 - 9.223372036854776e+18) & (long)(double)local_298 >> 0x3f |
       (long)(double)local_298;
  local_228 = 0;
  local_238 = 0x81010004;
  local_230 = local_1b8;
  cv::sum((_InputArray *)local_298);
  puVar7 = (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar7[1] = (long)((double)local_298 - 9.223372036854776e+18) & (long)(double)local_298 >> 0x3f |
              (long)(double)local_298;
  if ((long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar13 = 0;
  }
  else {
    lVar16 = (long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar20 = 0.0;
    lVar17 = 0;
    do {
      dVar20 = dVar20 + (double)RemSP::mem_P_.accesses_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar16 + (ulong)(lVar16 == 0) != lVar17);
    uVar13 = (long)(dVar20 - 9.223372036854776e+18) & (long)dVar20 >> 0x3f | (long)dVar20;
  }
  puVar7[2] = uVar13;
  MemMat<int>::GetImage((Mat_<int> *)local_298,(MemMat<int> *)local_220);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     (Mat *)local_298);
  cv::Mat::~Mat((Mat *)local_298);
  pRVar12 = (this->data_runs).runs;
  if (pRVar12 != (Run *)0x0) {
    operator_delete__(pRVar12);
  }
  puVar11 = (this->data_compressed).bits;
  if (puVar11 != (uint64_t *)0x0) {
    operator_delete__(puVar11);
  }
  cv::Mat::~Mat(local_1b8);
  cv::Mat::~Mat((Mat *)(local_220 + 8));
  cv::Mat::~Mat(&local_158.accesses_.super_Mat);
  cv::Mat::~Mat(&local_158.img_.super_Mat);
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses) {
        //Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedDataMem(data_compressed, img);

        //find runs
        data_runs.Alloc(h, w);
        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();
        FindRunsMem(data_compressed.bits, h, data_compressed.data_width, data_runs.runs);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h; i++) {
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (; j < w; j++) img_labels(i, j) = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::MemGetLabel(runs->label);
                for (; j < start_pos; j++) img_labels(i, j) = 0;
                for (; j < end_pos; j++) img_labels(i, j) = label;
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();
        data_runs.Dealloc();
        data_compressed.Dealloc();
    }